

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOrder.c
# Opt level: O3

void Abc_NtkImplementCiOrder(Abc_Ntk_t *pNtk,char *pFileName,int fReverse,int fVerbose)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  Vec_Ptr_t *vSupp;
  void **ppvVar3;
  Abc_Obj_t *pAVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  char Buffer [1000];
  char local_418 [1000];
  
  __stream = fopen(pFileName,"r");
  uVar2 = pNtk->vCis->nSize;
  vSupp = (Vec_Ptr_t *)malloc(0x10);
  uVar7 = 8;
  if (6 < uVar2 - 1) {
    uVar7 = (ulong)uVar2;
  }
  vSupp->nSize = 0;
  iVar1 = (int)uVar7;
  vSupp->nCap = iVar1;
  uVar5 = 0;
  if (iVar1 == 0) {
    ppvVar3 = (void **)0x0;
  }
  else {
    ppvVar3 = (void **)malloc((long)iVar1 << 3);
  }
  vSupp->pArray = ppvVar3;
  iVar1 = __isoc99_fscanf(__stream,"%s",local_418);
  if (iVar1 == 1) {
    uVar6 = 0;
    do {
      pAVar4 = Abc_NtkFindCi(pNtk,local_418);
      if ((pAVar4 == (Abc_Obj_t *)0x0) ||
         ((uVar2 = *(uint *)&pAVar4->field_0x14 & 0xf, uVar2 != 2 && (uVar2 != 5)))) {
        printf("Name \"%s\" is not a PI name. Cannot use this order.\n",local_418);
        if (vSupp->pArray != (void **)0x0) {
          free(vSupp->pArray);
        }
        free(vSupp);
        fclose(__stream);
        return;
      }
      iVar1 = (int)uVar7;
      if ((int)uVar6 == iVar1) {
        if (iVar1 < 0x10) {
          if (vSupp->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(vSupp->pArray,0x80);
          }
          vSupp->pArray = ppvVar3;
          vSupp->nCap = 0x10;
          uVar7 = 0x10;
        }
        else {
          uVar7 = (ulong)(uint)(iVar1 * 2);
          if (vSupp->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(uVar7 * 8);
          }
          else {
            ppvVar3 = (void **)realloc(vSupp->pArray,uVar7 * 8);
          }
          vSupp->pArray = ppvVar3;
          vSupp->nCap = iVar1 * 2;
        }
      }
      else {
        ppvVar3 = vSupp->pArray;
      }
      uVar5 = uVar6 + 1;
      vSupp->nSize = (int)uVar5;
      ppvVar3[uVar6] = pAVar4;
      iVar1 = __isoc99_fscanf(__stream,"%s",local_418);
      uVar6 = uVar5;
    } while (iVar1 == 1);
  }
  fclose(__stream);
  if ((int)uVar5 == pNtk->vCis->nSize) {
    Abc_NtkChangeCiOrder(pNtk,vSupp,fReverse);
    if (vSupp->pArray != (void **)0x0) {
      free(vSupp->pArray);
    }
  }
  else {
    printf("The number of names in the order (%d) is not the same as the number of PIs (%d).\n",
           uVar5 & 0xffffffff);
    if (vSupp->pArray != (void **)0x0) {
      free(vSupp->pArray);
    }
  }
  free(vSupp);
  return;
}

Assistant:

void Abc_NtkImplementCiOrder( Abc_Ntk_t * pNtk, char * pFileName, int fReverse, int fVerbose )
{
    char Buffer[1000];
    FILE * pFile;
    Vec_Ptr_t * vSupp;
    Abc_Obj_t * pObj;
    pFile = fopen( pFileName, "r" );
    vSupp = Vec_PtrAlloc( Abc_NtkCiNum(pNtk) );
    while ( fscanf( pFile, "%s", Buffer ) == 1 )
    {
        pObj = Abc_NtkFindCi( pNtk, Buffer );
        if ( pObj == NULL || !Abc_ObjIsCi(pObj) )
        {
            printf( "Name \"%s\" is not a PI name. Cannot use this order.\n", Buffer );
            Vec_PtrFree( vSupp );
            fclose( pFile );
            return;
        }
        Vec_PtrPush( vSupp, pObj );
    }
    fclose( pFile );
    if ( Vec_PtrSize(vSupp) != Abc_NtkCiNum(pNtk) )
    {
        printf( "The number of names in the order (%d) is not the same as the number of PIs (%d).\n", Vec_PtrSize(vSupp), Abc_NtkCiNum(pNtk) );
        Vec_PtrFree( vSupp );
        return;
    }
    Abc_NtkChangeCiOrder( pNtk, vSupp, fReverse );
    Vec_PtrFree( vSupp );
}